

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

string * GetPublicIPv4_abi_cxx11_(void)

{
  logLevelTy lVar1;
  uint uVar2;
  long lVar3;
  string *in_RDI;
  long httpResponse;
  CURLcode cc;
  CURL *pCurl;
  string readBuf;
  char curl_errtxt [256];
  allocator<char> *in_stack_fffffffffffffeb0;
  ulong uVar4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string local_128 [32];
  undefined1 local_108 [120];
  
  std::__cxx11::string::string(local_128);
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar1 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar1 < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x2ac,"GetPublicIPv4",logERR,"Could not initialize easy CURL");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec3);
  }
  else {
    std::__cxx11::string::reserve((ulong)local_128);
    curl_easy_setopt(lVar3,99,1);
    curl_easy_setopt(lVar3,0xd,5);
    curl_easy_setopt(lVar3,0x271a,local_108);
    curl_easy_setopt(lVar3,0x4e2b,CBReadToStringBuf);
    curl_easy_setopt(lVar3,0x2711,local_128);
    curl_easy_setopt(lVar3,0x2722,HTTP_USER_AGENT);
    curl_easy_setopt(lVar3,0x2712,"https://api.ipify.org/");
    curl_easy_setopt(lVar3,0xd8,2);
    uVar2 = curl_easy_perform(lVar3);
    if (uVar2 == 0) {
      uVar4 = 0;
      curl_easy_getinfo(lVar3,0x200002,&stack0xfffffffffffffeb0);
      if (uVar4 != 200) {
        lVar1 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar1 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x2c3,"GetPublicIPv4",logERR,"HTPP response was not OK but %d",uVar4 & 0xffffffff)
          ;
        }
        std::__cxx11::string::clear();
      }
    }
    else {
      lVar1 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar1 < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
               ,0x2c8,"GetPublicIPv4",logERR,"CURL call failed (%d)",(ulong)uVar2);
      }
      std::__cxx11::string::clear();
    }
    curl_easy_cleanup(lVar3);
    std::__cxx11::string::string((string *)in_RDI,local_128);
  }
  std::__cxx11::string::~string(local_128);
  return in_RDI;
}

Assistant:

std::string GetPublicIPv4 ()
{
    char curl_errtxt[CURL_ERROR_SIZE];
    std::string readBuf;
    
    // initialize the CURL handle
    CURL *pCurl = curl_easy_init();
    if (!pCurl) {
        LOG_MSG(logERR,ERR_CURL_EASY_INIT);
        return "";
    }

    // Setup buffer and CURL handle
    readBuf.reserve(CURL_MAX_WRITE_SIZE);
    curl_easy_setopt(pCurl, CURLOPT_NOSIGNAL, 1);
    curl_easy_setopt(pCurl, CURLOPT_TIMEOUT, 5);
    curl_easy_setopt(pCurl, CURLOPT_ERRORBUFFER, curl_errtxt);
    curl_easy_setopt(pCurl, CURLOPT_WRITEFUNCTION, CBReadToStringBuf);
    curl_easy_setopt(pCurl, CURLOPT_WRITEDATA, &readBuf);
    curl_easy_setopt(pCurl, CURLOPT_USERAGENT, HTTP_USER_AGENT);
    curl_easy_setopt(pCurl, CURLOPT_URL, "https://api.ipify.org/");
    curl_easy_setopt(pCurl, CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);

    // Perform the CURL call to read from the URL
    const CURLcode cc = curl_easy_perform(pCurl);
    if (cc == CURLE_OK) {
        // CURL was OK, now check HTTP response code
        long httpResponse = 0;
        curl_easy_getinfo(pCurl, CURLINFO_RESPONSE_CODE, &httpResponse);
        // Not HTTP_OK?
        if (httpResponse != HTTP_OK) {
            LOG_MSG(logERR, "HTPP response was not OK but %d", (int)httpResponse);
            readBuf.clear();
        }

    } else {
        LOG_MSG(logERR, "CURL call failed (%d)", (int)cc);
        readBuf.clear();
    }
    
    // cleanup CURL handle
    curl_easy_cleanup(pCurl);
    
    // return what we've read
    return readBuf;
}